

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utOpenGEXImportExport.cpp
# Opt level: O0

void __thiscall
utOpenGEXImportExport_Importissue1340_EmptyCameraObject_Test::TestBody
          (utOpenGEXImportExport_Importissue1340_EmptyCameraObject_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_58;
  Message local_50;
  void *local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  aiScene *local_20;
  aiScene *scene;
  Importer importer;
  utOpenGEXImportExport_Importissue1340_EmptyCameraObject_Test *this_local;
  
  importer.pimpl = (ImporterPimpl *)this;
  Assimp::Importer::Importer((Importer *)&scene);
  local_20 = Assimp::Importer::ReadFile
                       ((Importer *)&scene,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/OpenGEX/empty_camera.ogex"
                        ,0);
  local_48 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_40,"nullptr","scene",&local_48,&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utOpenGEXImportExport.cpp"
               ,0x4b,message);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  Assimp::Importer::~Importer((Importer *)&scene);
  return;
}

Assistant:

TEST_F(utOpenGEXImportExport, Importissue1340_EmptyCameraObject) {
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/OpenGEX/empty_camera.ogex", 0);
    EXPECT_NE(nullptr, scene);
}